

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_cadd_bit(secp256k1_scalar *r,uint bit,int flag)

{
  uint64_t *puVar1;
  ulong *puVar2;
  secp256k1_fe *a;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  uint64_t uVar46;
  uint64_t uVar47;
  uint64_t uVar48;
  uint64_t uVar49;
  int iVar50;
  int iVar51;
  ulong uVar52;
  undefined1 *puVar53;
  byte bVar54;
  secp256k1_gej *in_RCX;
  byte bVar55;
  uint uVar56;
  secp256k1_fe *r_00;
  long extraout_RDX;
  ulong uVar57;
  secp256k1_fe *a_00;
  secp256k1_fe *psVar58;
  ulong uVar59;
  secp256k1_ge *a_01;
  uint uVar60;
  undefined4 in_register_00000034;
  uint64_t *puVar61;
  secp256k1_gej *a_02;
  secp256k1_gej *r_01;
  secp256k1_gej *r_02;
  ulong uVar62;
  ulong uVar63;
  long lVar64;
  undefined1 *puVar65;
  int vflag;
  undefined1 auStack_2c0 [128];
  ulong uStack_240;
  ulong uStack_238;
  ulong uStack_230;
  long lStack_228;
  undefined8 uStack_220;
  secp256k1_gej sStack_1d8;
  secp256k1_gej sStack_140;
  secp256k1_ge sStack_a8;
  
  puVar61 = (uint64_t *)CONCAT44(in_register_00000034,bit);
  if (bit < 0x100) {
    in_RCX = (secp256k1_gej *)(ulong)bit;
    uVar60 = flag - 1U & 0x100 | bit;
    uVar56 = uVar60 >> 6;
    bVar54 = (byte)bit;
    uVar52 = (ulong)(uVar60 < 0x40) << (bVar54 & 0x3f);
    puVar61 = (uint64_t *)((ulong)(uVar56 == 1) << (bVar54 & 0x3f));
    uVar62 = (ulong)(uVar56 == 2) << (bVar54 & 0x3f);
    uVar63 = (ulong)(uVar56 == 3) << (bVar54 & 0x3f);
    uVar59 = r->d[0];
    r->d[0] = r->d[0] + uVar52;
    puVar1 = r->d + 1;
    uVar57 = (ulong)CARRY8(uVar59,uVar52);
    uVar59 = *puVar1;
    uVar52 = *puVar1;
    *puVar1 = uVar52 + (long)puVar61 + uVar57;
    puVar1 = r->d + 2;
    uVar52 = (ulong)(CARRY8(uVar59,(ulong)puVar61) || CARRY8(uVar52 + (long)puVar61,uVar57));
    uVar59 = *puVar1;
    uVar57 = *puVar1 + uVar62;
    *puVar1 = uVar57 + uVar52;
    puVar1 = r->d + 3;
    uVar52 = (ulong)(CARRY8(uVar59,uVar62) || CARRY8(uVar57,uVar52));
    uVar59 = *puVar1;
    uVar57 = *puVar1 + uVar63;
    *puVar1 = uVar57 + uVar52;
    if (!CARRY8(uVar59,uVar63) && !CARRY8(uVar57,uVar52)) {
      return;
    }
  }
  else {
    secp256k1_scalar_cadd_bit_cold_2();
  }
  secp256k1_scalar_cadd_bit_cold_1();
  if ((int)puVar61 < 1) {
    secp256k1_scalar_shr_int_cold_2();
  }
  else if ((int)puVar61 < 0x10) {
    bVar54 = (byte)puVar61;
    uVar59 = (((secp256k1_ge *)r)->x).n[1];
    bVar55 = -bVar54;
    (((secp256k1_ge *)r)->x).n[0] =
         (uVar59 << (bVar55 & 0x3f)) + ((((secp256k1_ge *)r)->x).n[0] >> (bVar54 & 0x3f));
    uVar52 = (((secp256k1_ge *)r)->x).n[2];
    (((secp256k1_ge *)r)->x).n[1] = (uVar52 << (bVar55 & 0x3f)) + (uVar59 >> (bVar54 & 0x3f));
    uVar59 = (((secp256k1_ge *)r)->x).n[3];
    (((secp256k1_ge *)r)->x).n[2] = (uVar59 << (bVar55 & 0x3f)) + (uVar52 >> (bVar54 & 0x3f));
    (((secp256k1_ge *)r)->x).n[3] = uVar59 >> (bVar54 & 0x3f);
    return;
  }
  secp256k1_scalar_shr_int_cold_1();
  if (in_RCX->infinity == 0) {
    secp256k1_gej_double_var(&sStack_140,in_RCX,(secp256k1_fe *)0x0);
    secp256k1_ge_set_xy(&sStack_a8,&sStack_140.x,&sStack_140.y);
    secp256k1_ge_set_gej_zinv((secp256k1_ge *)r,in_RCX,&sStack_140.z);
    secp256k1_gej_set_ge(&sStack_1d8,(secp256k1_ge *)r);
    sStack_1d8.z.n[0] = (in_RCX->z).n[0];
    sStack_1d8.z.n[1] = (in_RCX->z).n[1];
    sStack_1d8.z.n[2] = (in_RCX->z).n[2];
    sStack_1d8.z.n[3] = (in_RCX->z).n[3];
    sStack_1d8.z.n[4] = (in_RCX->z).n[4];
    sStack_1d8.z.magnitude = (in_RCX->z).magnitude;
    sStack_1d8.z.normalized = (in_RCX->z).normalized;
    puVar61[4] = sStack_140.z.n[4];
    puVar61[5] = sStack_140.z._40_8_;
    puVar61[2] = sStack_140.z.n[2];
    puVar61[3] = sStack_140.z.n[3];
    *puVar61 = sStack_140.z.n[0];
    puVar61[1] = sStack_140.z.n[1];
    lVar64 = 0x30;
    do {
      r = (secp256k1_scalar *)((long)r + 0x68);
      secp256k1_gej_add_ge_var
                (&sStack_1d8,&sStack_1d8,&sStack_a8,(secp256k1_fe *)((long)puVar61 + lVar64));
      secp256k1_ge_set_xy((secp256k1_ge *)r,&sStack_1d8.x,&sStack_1d8.y);
      lVar64 = lVar64 + 0x30;
    } while (lVar64 != 0x180);
    secp256k1_fe_mul(r_00,&sStack_1d8.z,&sStack_140.z);
    return;
  }
  secp256k1_ecmult_odd_multiples_table_cold_1();
  puVar53 = &((secp256k1_ge *)((long)r + -0x68))->field_0x67;
  if ((secp256k1_ge *)r != (secp256k1_ge *)0x0) {
    secp256k1_ge_verify((secp256k1_ge *)(puVar61 + (long)puVar53 * 0xd));
    lVar64 = (long)puVar53 * 0x30;
    secp256k1_fe_verify((secp256k1_fe *)(extraout_RDX + lVar64));
    psVar58 = (secp256k1_fe *)(puVar61 + (long)puVar53 * 0xd + 6);
    secp256k1_fe_verify(psVar58);
    uVar59 = puVar61[(long)puVar53 * 0xd + 10];
    uVar57 = (uVar59 >> 0x30) * 0x1000003d1 + psVar58->n[0];
    uVar52 = (uVar57 >> 0x34) + puVar61[(long)puVar53 * 0xd + 7];
    uVar62 = (uVar52 >> 0x34) + puVar61[(long)puVar53 * 0xd + 8];
    uVar63 = (uVar62 >> 0x34) + puVar61[(long)puVar53 * 0xd + 9];
    a_02 = (secp256k1_gej *)(uVar62 & 0xfffffffffffff);
    psVar58->n[0] = uVar57 & 0xfffffffffffff;
    puVar61[(long)puVar53 * 0xd + 7] = uVar52 & 0xfffffffffffff;
    puVar61[(long)puVar53 * 0xd + 8] = (uint64_t)a_02;
    puVar61[(long)puVar53 * 0xd + 9] = uVar63 & 0xfffffffffffff;
    puVar61[(long)puVar53 * 0xd + 10] = (uVar63 >> 0x34) + (uVar59 & 0xffffffffffff);
    *(undefined4 *)(puVar61 + (long)puVar53 * 0xd + 0xb) = 1;
    secp256k1_fe_verify(psVar58);
    auStack_2c0._0_8_ = *(ulong *)(extraout_RDX + lVar64);
    auStack_2c0._8_8_ = ((ulong *)(extraout_RDX + lVar64))[1];
    puVar2 = (ulong *)(extraout_RDX + 0x10 + lVar64);
    auStack_2c0._16_8_ = *puVar2;
    auStack_2c0._24_8_ = puVar2[1];
    puVar2 = (ulong *)(extraout_RDX + 0x20 + lVar64);
    auStack_2c0._32_8_ = *puVar2;
    auStack_2c0._40_8_ = puVar2[1];
    if (puVar53 != (undefined1 *)0x0) {
      a_01 = (secp256k1_ge *)(puVar61 + (long)r * 0xd + -0x1a);
      psVar58 = (secp256k1_fe *)(extraout_RDX + (long)r * 0x30);
      puVar65 = (undefined1 *)0x0;
      do {
        r_02 = (secp256k1_gej *)auStack_2c0;
        psVar58 = psVar58 + -1;
        secp256k1_fe_verify(psVar58);
        secp256k1_ge_verify(a_01 + 1);
        if (puVar65 != (undefined1 *)0x0) {
          a_02 = r_02;
          secp256k1_fe_mul((secp256k1_fe *)r_02,(secp256k1_fe *)r_02,psVar58);
        }
        secp256k1_ge_verify(a_01);
        r_01 = r_02;
        secp256k1_fe_verify((secp256k1_fe *)r_02);
        if (a_01->infinity != 0) {
          secp256k1_ge_table_set_globalz_cold_1();
LAB_0014c606:
          secp256k1_ge_table_set_globalz_cold_2();
          secp256k1_gej_verify(a_02);
          if (a_02->infinity == 0) {
            if (a_00 != (secp256k1_fe *)0x0) {
              uVar46 = (a_02->y).n[0];
              uVar47 = (a_02->y).n[1];
              uVar48 = (a_02->y).n[2];
              uVar49 = (a_02->y).n[3];
              iVar50 = (a_02->y).magnitude;
              iVar51 = (a_02->y).normalized;
              a_00->n[4] = (a_02->y).n[4];
              a_00->magnitude = iVar50;
              a_00->normalized = iVar51;
              a_00->n[2] = uVar48;
              a_00->n[3] = uVar49;
              a_00->n[0] = uVar46;
              a_00->n[1] = uVar47;
              secp256k1_fe_verify(a_00);
              uVar59 = a_00->n[4];
              uVar57 = (uVar59 >> 0x30) * 0x1000003d1 + a_00->n[0];
              uVar52 = (uVar57 >> 0x34) + a_00->n[1];
              uVar62 = (uVar52 >> 0x34) + a_00->n[2];
              uVar63 = (uVar62 >> 0x34) + a_00->n[3];
              a_00->n[0] = uVar57 & 0xfffffffffffff;
              a_00->n[1] = uVar52 & 0xfffffffffffff;
              a_00->n[2] = uVar62 & 0xfffffffffffff;
              a_00->n[3] = uVar63 & 0xfffffffffffff;
              a_00->n[4] = (uVar63 >> 0x34) + (uVar59 & 0xffffffffffff);
              a_00->magnitude = 1;
              secp256k1_fe_verify(a_00);
            }
            secp256k1_gej_double(r_01,a_02);
            secp256k1_gej_verify(r_01);
            return;
          }
          secp256k1_gej_set_infinity(r_01);
          if (a_00 != (secp256k1_fe *)0x0) {
            a_00->n[0] = 1;
            a_00->n[1] = 0;
            a_00->n[2] = 0;
            a_00->n[3] = 0;
            a_00->n[4] = 0;
            a_00->magnitude = 1;
            a_00->normalized = 1;
            secp256k1_fe_verify(a_00);
            return;
          }
          return;
        }
        secp256k1_fe_verify((secp256k1_fe *)r_02);
        r_01 = r_02;
        if (8 < (int)auStack_2c0._40_4_) goto LAB_0014c606;
        a = (secp256k1_fe *)(auStack_2c0 + 0x78);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = auStack_2c0._0_8_ * 2;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = auStack_2c0._24_8_;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = auStack_2c0._8_8_ * 2;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = auStack_2c0._16_8_;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = auStack_2c0._32_8_;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = auStack_2c0._32_8_;
        uVar52 = SUB168(auVar5 * auVar25,0);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar52 & 0xfffffffffffff;
        auVar3 = auVar4 * auVar24 + auVar3 * auVar23 + auVar6 * ZEXT816(0x1000003d10);
        uVar59 = auVar3._0_8_;
        auStack_2c0._72_8_ = uVar59 & 0xfffffffffffff;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = uVar59 >> 0x34 | auVar3._8_8_ << 0xc;
        uVar59 = auStack_2c0._32_8_ * 2;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = auStack_2c0._0_8_;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar59;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = auStack_2c0._8_8_ * 2;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = auStack_2c0._24_8_;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = auStack_2c0._16_8_;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = auStack_2c0._16_8_;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar52 >> 0x34 | SUB168(auVar5 * auVar25,8) << 0xc;
        auVar3 = auVar7 * auVar26 + auVar39 + auVar8 * auVar27 + auVar9 * auVar28 +
                 auVar10 * ZEXT816(0x1000003d10);
        auStack_2c0._64_8_ = auVar3._0_8_;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = (ulong)auStack_2c0._64_8_ >> 0x34 | auVar3._8_8_ << 0xc;
        auStack_2c0._56_8_ = (auStack_2c0._64_8_ & 0xfffffffffffff) >> 0x30;
        auStack_2c0._64_8_ = auStack_2c0._64_8_ & 0xffffffffffff;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = auStack_2c0._0_8_;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = auStack_2c0._0_8_;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = auStack_2c0._8_8_;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uVar59;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = auStack_2c0._16_8_ * 2;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = auStack_2c0._24_8_;
        auVar3 = auVar12 * auVar30 + auVar40 + auVar13 * auVar31;
        uVar52 = auVar3._0_8_;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = uVar52 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = (uVar52 & 0xfffffffffffff) << 4 | auStack_2c0._56_8_;
        auVar3 = auVar11 * auVar29 + ZEXT816(0x1000003d1) * auVar32;
        uVar52 = auVar3._0_8_;
        auStack_2c0._120_8_ = uVar52 & 0xfffffffffffff;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar52 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = auStack_2c0._0_8_ * 2;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = auStack_2c0._8_8_;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = auStack_2c0._16_8_;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar59;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = auStack_2c0._24_8_;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = auStack_2c0._24_8_;
        auVar4 = auVar15 * auVar34 + auVar42 + auVar16 * auVar35;
        uVar52 = auVar4._0_8_;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uVar52 & 0xfffffffffffff;
        auVar3 = auVar14 * auVar33 + auVar41 + auVar17 * ZEXT816(0x1000003d10);
        uVar57 = auVar3._0_8_;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = uVar52 >> 0x34 | auVar4._8_8_ << 0xc;
        uStack_240 = uVar57 & 0xfffffffffffff;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = uVar57 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = auStack_2c0._0_8_ * 2;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = auStack_2c0._16_8_;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = auStack_2c0._8_8_;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = auStack_2c0._8_8_;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = auStack_2c0._24_8_;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = uVar59;
        auVar44 = auVar20 * auVar38 + auVar44;
        uVar59 = auVar44._0_8_;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar59 & 0xfffffffffffff;
        auVar3 = auVar18 * auVar36 + auVar43 + auVar19 * auVar37 + auVar21 * ZEXT816(0x1000003d10);
        uVar52 = auVar3._0_8_;
        uStack_238 = uVar52 & 0xfffffffffffff;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = (uVar52 >> 0x34 | auVar3._8_8_ << 0xc) + auStack_2c0._72_8_;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar59 >> 0x34 | auVar44._8_8_ << 0xc;
        auVar45 = auVar22 * ZEXT816(0x1000003d10) + auVar45;
        uVar59 = auVar45._0_8_;
        uStack_230 = uVar59 & 0xfffffffffffff;
        lStack_228 = (uVar59 >> 0x34 | auVar45._8_8_ << 0xc) + auStack_2c0._64_8_;
        uStack_220 = 1;
        secp256k1_fe_verify(a);
        secp256k1_fe_mul((secp256k1_fe *)(auStack_2c0 + 0x48),a,(secp256k1_fe *)auStack_2c0);
        secp256k1_fe_mul(&a_01->x,&a_01->x,a);
        a_02 = (secp256k1_gej *)&a_01->y;
        secp256k1_fe_mul((secp256k1_fe *)a_02,(secp256k1_fe *)a_02,
                         (secp256k1_fe *)(auStack_2c0 + 0x48));
        secp256k1_ge_verify(a_01);
        secp256k1_ge_verify(a_01);
        puVar65 = puVar65 + 1;
        a_01 = a_01 + -1;
      } while (puVar53 != puVar65);
    }
  }
  return;
}

Assistant:

static void secp256k1_scalar_cadd_bit(secp256k1_scalar *r, unsigned int bit, int flag) {
    secp256k1_uint128 t;
    volatile int vflag = flag;
    VERIFY_CHECK(bit < 256);
    bit += ((uint32_t) vflag - 1) & 0x100;  /* forcing (bit >> 6) > 3 makes this a noop */
    secp256k1_u128_from_u64(&t, r->d[0]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 0)) << (bit & 0x3F));
    r->d[0] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[1]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 1)) << (bit & 0x3F));
    r->d[1] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[2]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 2)) << (bit & 0x3F));
    r->d[2] = secp256k1_u128_to_u64(&t); secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[3]);
    secp256k1_u128_accum_u64(&t, ((uint64_t)((bit >> 6) == 3)) << (bit & 0x3F));
    r->d[3] = secp256k1_u128_to_u64(&t);
#ifdef VERIFY
    VERIFY_CHECK(secp256k1_u128_hi_u64(&t) == 0);
#endif
}